

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall
gvr::anon_unknown_3::PLYValueList::PLYValueList
          (PLYValueList *this,ply_type t_size,ply_type t_value,ply_encoding encoding)

{
  PLYValue *pPVar1;
  reference ppPVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  PLYValue *in_RDI;
  ply_encoding in_stack_00000088;
  ply_type in_stack_0000008c;
  size_type in_stack_ffffffffffffffd8;
  vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *in_stack_ffffffffffffffe0;
  
  PLYValue::PLYValue(in_RDI);
  in_RDI->_vptr_PLYValue = (_func_int **)&PTR__PLYValueList_0016a648;
  std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::vector
            ((vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *)0x126fd1);
  *(undefined4 *)&in_RDI[1]._vptr_PLYValue = in_ECX;
  pPVar1 = createValue(in_stack_0000008c,in_stack_00000088);
  in_RDI[2]._vptr_PLYValue = (_func_int **)pPVar1;
  *(undefined4 *)&in_RDI[3]._vptr_PLYValue = in_EDX;
  in_RDI[4]._vptr_PLYValue = (_func_int **)0x0;
  std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pPVar1 = createValue(in_stack_0000008c,in_stack_00000088);
  ppPVar2 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::operator[]
                      ((vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *)(in_RDI + 5),0);
  *ppPVar2 = pPVar1;
  return;
}

Assistant:

PLYValueList(ply_type t_size, ply_type t_value, ply_encoding encoding)
    {
      enc=encoding;
      size=createValue(t_size, encoding);
      tvalue=t_value;
      used=0;
      list.resize(1);
      list[0]=createValue(t_value, encoding);
    }